

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::LinkProgram::exec(LinkProgram *this,Thread *t)

{
  deUint32 err;
  deBool dVar1;
  Program *pPVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_358;
  MessageBuilder local_1b8;
  GLuint local_24;
  Thread *pTStack_20;
  GLuint program;
  EGLThread *thread;
  Thread *t_local;
  LinkProgram *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  pTStack_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0)
  ;
  if (pTStack_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  pPVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
  local_24 = pPVar2->program;
  tcu::ThreadUtil::Thread::newMessage(&local_1b8,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [24])"Begin -- glLinkProgram(");
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&local_24);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2a85ff4);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b8);
  do {
    (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0xce8))(local_24);
    err = (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"linkProgram(program)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x67b);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_358,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_358,(char (*) [23])"End -- glLinkProgram()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_358);
  return;
}

Assistant:

void LinkProgram::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint program = m_program->program;

	thread.newMessage() << "Begin -- glLinkProgram(" << program << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, linkProgram(program));
	thread.newMessage() << "End -- glLinkProgram()" << tcu::ThreadUtil::Message::End;
}